

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::handleFunctionBody
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *functionBody,
          TIntermNode **node)

{
  pointer *pppTVar1;
  TIntermediate *this_00;
  char *__s;
  int iVar2;
  int iVar3;
  TIntermAggregate *node_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pool_allocator<char> local_60;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  
  node_00 = TIntermediate::growAggregate
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,*node,
                       functionBody);
  *node = (TIntermNode *)node_00;
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  TIntermediate::setAggregateOperator
            (this_00,(TIntermNode *)node_00,EOpFunction,(TType *)CONCAT44(extraout_var,iVar2),loc);
  iVar2 = (*(*node)->_vptr_TIntermNode[6])();
  iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[6])(function);
  __s = *(char **)(CONCAT44(extraout_var_01,iVar3) + 8);
  local_60.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>(local_58,__s,&local_60);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x1a0))
            ((long *)CONCAT44(extraout_var_00,iVar2));
  TSymbolTable::pop((this->super_TParseContextBase).symbolTable,(TPrecisionQualifier *)0x0);
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x21])(function);
  if ((char)iVar2 != '\0') {
    pppTVar1 = &(this->implicitThisStack).
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + -1;
  }
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x38))
                    ((long *)CONCAT44(extraout_var_02,iVar2));
  if ((iVar2 != 0) && ((this->super_TParseContextBase).functionReturnsValue == false)) {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"function does not return a value:","",
               *(undefined8 *)(CONCAT44(extraout_var_03,iVar2) + 8));
  }
  return;
}

Assistant:

void HlslParseContext::handleFunctionBody(const TSourceLoc& loc, TFunction& function, TIntermNode* functionBody,
                                          TIntermNode*& node)
{
    node = intermediate.growAggregate(node, functionBody);
    intermediate.setAggregateOperator(node, EOpFunction, function.getType(), loc);
    node->getAsAggregate()->setName(function.getMangledName().c_str());

    popScope();
    if (function.hasImplicitThis())
        popImplicitThis();

    if (function.getType().getBasicType() != EbtVoid && ! functionReturnsValue)
        error(loc, "function does not return a value:", "", function.getName().c_str());
}